

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMT_SYM_DEF_OBJECT_Unmarshal
                 (TPMT_SYM_DEF_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_SYM_OBJECT_Unmarshal(&target->algorithm,buffer,size,flag);
  if (TVar1 == 0) {
    TVar1 = TPMU_SYM_KEY_BITS_Unmarshal(&target->keyBits,buffer,size,(uint)target->algorithm);
    if (TVar1 == 0) {
      TVar1 = TPMU_SYM_MODE_Unmarshal(&target->mode,buffer,size,(uint)target->algorithm);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMT_SYM_DEF_OBJECT_Unmarshal(TPMT_SYM_DEF_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_SYM_OBJECT_Unmarshal((TPMI_ALG_SYM_OBJECT *)&(target->algorithm), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SYM_KEY_BITS_Unmarshal((TPMU_SYM_KEY_BITS *)&(target->keyBits), buffer, size, (UINT32)target->algorithm);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SYM_MODE_Unmarshal((TPMU_SYM_MODE *)&(target->mode), buffer, size, (UINT32)target->algorithm);
    return result;
}